

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderCross.h
# Opt level: O1

void __thiscall FIX44::NewOrderCross::NoSides::NoPartyIDs::NoPartyIDs(NoPartyIDs *this)

{
  int *piVar1;
  atomic<long> *counter;
  message_order local_30;
  
  FIX::message_order::message_order(&local_30,0x1c0,0x1bf,0x1c4,0x322,0);
  FIX::FieldMap::FieldMap((FieldMap *)this,&local_30);
  piVar1 = local_30.m_groupOrder.m_buffer;
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00327cc8;
  (this->super_Group).m_field = 0x1c5;
  (this->super_Group).m_delim = 0x1c0;
  if ((long *)local_30.m_groupOrder.m_buffer != (long *)0x0) {
    LOCK();
    *(long *)local_30.m_groupOrder.m_buffer = *(long *)local_30.m_groupOrder.m_buffer + -1;
    UNLOCK();
    if (*(long *)local_30.m_groupOrder.m_buffer == 0) {
      local_30.m_groupOrder.m_size = 0;
      local_30.m_groupOrder.m_buffer = (int *)0x0;
      if ((long *)piVar1 != (long *)0x0) {
        operator_delete__(piVar1);
      }
    }
  }
  *(undefined ***)&this->super_Group = &PTR__FieldMap_0032b2e8;
  return;
}

Assistant:

NoPartyIDs() : FIX::Group(453,448,FIX::message_order(448,447,452,802,0)) {}